

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDiscreteAccessoryType,_0UL>::
         Construct(DB *db,LIST *params)

{
  IfcDiscreteAccessoryType *in;
  
  in = (IfcDiscreteAccessoryType *)operator_new(0x1b8);
  *(undefined ***)&(in->super_IfcElementComponentType).field_0x1a0 = &PTR__Object_008ee2a0;
  *(undefined8 *)&in->field_0x1a8 = 0;
  *(char **)&in->field_0x1b0 = "IfcDiscreteAccessoryType";
  Assimp::IFC::Schema_2x3::IfcElementComponentType::IfcElementComponentType
            ((IfcElementComponentType *)in,&PTR_construction_vtable_24__0094ccb0);
  *(undefined ***)
   &(in->super_IfcElementComponentType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject = &PTR__IfcDiscreteAccessoryType_0094cb80;
  *(undefined ***)&(in->super_IfcElementComponentType).field_0x1a0 =
       &PTR__IfcDiscreteAccessoryType_0094cc98;
  *(undefined ***)
   &(in->super_IfcElementComponentType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0x88 = &PTR__IfcDiscreteAccessoryType_0094cba8;
  (in->super_IfcElementComponentType).super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcDiscreteAccessoryType_0094cbd0;
  *(undefined ***)
   &(in->super_IfcElementComponentType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0xf0 = &PTR__IfcDiscreteAccessoryType_0094cbf8;
  *(undefined ***)
   &(in->super_IfcElementComponentType).super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       &PTR__IfcDiscreteAccessoryType_0094cc20;
  *(undefined ***)&(in->super_IfcElementComponentType).super_IfcElementType.field_0x180 =
       &PTR__IfcDiscreteAccessoryType_0094cc48;
  *(undefined ***)&(in->super_IfcElementComponentType).super_IfcElementType.field_0x190 =
       &PTR__IfcDiscreteAccessoryType_0094cc70;
  GenericFill<Assimp::IFC::Schema_2x3::IfcDiscreteAccessoryType>(db,params,in);
  return (Object *)
         (&(in->super_IfcElementComponentType).super_IfcElementType.super_IfcTypeProduct.
           super_IfcTypeObject.field_0x0 +
         *(long *)(*(long *)&(in->super_IfcElementComponentType).super_IfcElementType.
                             super_IfcTypeProduct.super_IfcTypeObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }